

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_partial_sig_verify
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_pubnonce *pubnonce,secp256k1_pubkey *pubkey,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar e;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_musig_session_internal session_i;
  secp256k1_ge pkp;
  secp256k1_gej rj;
  secp256k1_gej tmp;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge nonce_pts [2];
  secp256k1_gej pkj;
  secp256k1_scalar local_530;
  secp256k1_scalar local_510;
  secp256k1_scalar local_4f0;
  secp256k1_musig_session_internal local_4d0;
  secp256k1_ge local_448;
  secp256k1_gej local_3e0;
  secp256k1_gej local_348;
  secp256k1_keyagg_cache_internal local_2b0;
  secp256k1_ge local_198 [2];
  secp256k1_gej local_c8;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x2ea,"test condition failed: ctx != NULL");
    abort();
  }
  if (partial_sig == (secp256k1_musig_partial_sig *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "partial_sig != NULL";
  }
  else if (pubnonce == (secp256k1_musig_pubnonce *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubnonce != NULL";
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  else if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "keyagg_cache != NULL";
  }
  else {
    if (session != (secp256k1_musig_session *)0x0) {
      iVar1 = secp256k1_musig_session_load(ctx,&local_4d0,session);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_musig_pubnonce_load(ctx,local_198,pubnonce);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_effective_nonce(&local_3e0,local_198,&local_4d0.noncecoef);
      iVar1 = secp256k1_pubkey_load(ctx,&local_448,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_keyagg_cache_load(ctx,&local_2b0,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_musig_keyaggcoef(&local_4f0,&local_2b0,&local_448);
      secp256k1_scalar_mul(&local_530,&local_4d0.challenge,&local_4f0);
      iVar1 = secp256k1_fe_is_odd(&local_2b0.pk.y);
      if (iVar1 != local_2b0.parity_acc) {
        secp256k1_scalar_negate(&local_530,&local_530);
      }
      iVar1 = secp256k1_musig_partial_sig_load(ctx,&local_510,partial_sig);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_negate(&local_510,&local_510);
      secp256k1_gej_set_ge(&local_c8,&local_448);
      secp256k1_ecmult(&local_348,&local_c8,&local_530,&local_510);
      if (local_4d0.fin_nonce_parity != 0) {
        secp256k1_gej_neg(&local_3e0,&local_3e0);
      }
      secp256k1_gej_add_var(&local_348,&local_348,&local_3e0,(secp256k1_fe *)0x0);
      iVar1 = secp256k1_gej_is_infinity(&local_348);
      return iVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "session != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_verify(const secp256k1_context* ctx, const secp256k1_musig_partial_sig *partial_sig, const secp256k1_musig_pubnonce *pubnonce, const secp256k1_pubkey *pubkey, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    secp256k1_scalar mu, e, s;
    secp256k1_gej pkj;
    secp256k1_ge nonce_pts[2];
    secp256k1_gej rj;
    secp256k1_gej tmp;
    secp256k1_ge pkp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(pubnonce != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }

    if (!secp256k1_musig_pubnonce_load(ctx, nonce_pts, pubnonce)) {
        return 0;
    }
    /* Compute "effective" nonce rj = nonce_pts[0] + b*nonce_pts[1] */
    /* TODO: use multiexp to compute -s*G + e*mu*pubkey + nonce_pts[0] + b*nonce_pts[1] */
    secp256k1_effective_nonce(&rj, nonce_pts, &session_i.noncecoef);

    if (!secp256k1_pubkey_load(ctx, &pkp, pubkey)) {
        return 0;
    }
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    /* Multiplying the challenge by the KeyAgg coefficient is equivalent
     * to multiplying the signer's public key by the coefficient, except
     * much easier to do. */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pkp);
    secp256k1_scalar_mul(&e, &session_i.challenge, &mu);

    /* Negate e if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let g' = g⋅gacc mod n" and the multiplication "g'⋅e"
     * in the specification. */
    if (secp256k1_fe_is_odd(&cache_i.pk.y)
            != cache_i.parity_acc) {
        secp256k1_scalar_negate(&e, &e);
    }

    if (!secp256k1_musig_partial_sig_load(ctx, &s, partial_sig)) {
        return 0;
    }
    /* Compute -s*G + e*pkj + rj (e already includes the keyagg coefficient mu) */
    secp256k1_scalar_negate(&s, &s);
    secp256k1_gej_set_ge(&pkj, &pkp);
    secp256k1_ecmult(&tmp, &pkj, &e, &s);
    if (session_i.fin_nonce_parity) {
        secp256k1_gej_neg(&rj, &rj);
    }
    secp256k1_gej_add_var(&tmp, &tmp, &rj, NULL);

    return secp256k1_gej_is_infinity(&tmp);
}